

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::activatePipelineStack
          (QPDFWriter *this,PipelinePopper *pp,bool discard,string *str,
          unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link)

{
  unsigned_long uVar1;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *str_00;
  bool bVar2;
  Count *pCVar3;
  element_type *peVar4;
  reference ppPVar5;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_58;
  undefined1 local_4d;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_40;
  Count *local_38;
  Count *c;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link_local;
  string *str_local;
  PipelinePopper *pPStack_18;
  bool discard_local;
  PipelinePopper *pp_local;
  QPDFWriter *this_local;
  
  c = (Count *)link;
  link_local = (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)str;
  str_local._7_1_ = discard;
  pPStack_18 = pp;
  pp_local = (PipelinePopper *)this;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)link);
  if (bVar2) {
    pCVar3 = (Count *)operator_new(0x58);
    local_4d = 1;
    peVar4 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    uVar1 = peVar4->next_stack_id;
    peVar4 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::unique_ptr
              (&local_40,link);
    ::qpdf::pl::Count::Count(pCVar3,uVar1,&peVar4->count_buffer,&local_40);
    local_4d = 0;
    local_38 = pCVar3;
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_40);
  }
  else if ((str_local._7_1_ & 1) == 0) {
    if (link_local == (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)0x0) {
      pCVar3 = (Count *)operator_new(0x58);
      peVar4 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar1 = peVar4->next_stack_id;
      peVar4 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      ppPVar5 = std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::back(&peVar4->pipeline_stack);
      ::qpdf::pl::Count::Count(pCVar3,uVar1,*ppPVar5);
      local_38 = pCVar3;
    }
    else {
      pCVar3 = (Count *)operator_new(0x58);
      peVar4 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      str_00 = link_local;
      uVar1 = peVar4->next_stack_id;
      std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>::
      unique_ptr<std::default_delete<qpdf::pl::Link>,void>
                ((unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>> *)&local_58,
                 (nullptr_t)0x0);
      ::qpdf::pl::Count::Count(pCVar3,uVar1,(string *)str_00,&local_58);
      local_38 = pCVar3;
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_58);
    }
  }
  else {
    pCVar3 = (Count *)operator_new(0x58);
    peVar4 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    ::qpdf::pl::Count::Count(pCVar3,peVar4->next_stack_id,(Pipeline *)0x0);
    local_38 = pCVar3;
  }
  peVar4 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  pPStack_18->stack_id = peVar4->next_stack_id;
  peVar4 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::vector<Pipeline*,std::allocator<Pipeline*>>::emplace_back<qpdf::pl::Count*&>
            ((vector<Pipeline*,std::allocator<Pipeline*>> *)&peVar4->pipeline_stack,&local_38);
  pCVar3 = local_38;
  peVar4 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4->pipeline = pCVar3;
  peVar4 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4->next_stack_id = peVar4->next_stack_id + 1;
  return;
}

Assistant:

void
QPDFWriter::activatePipelineStack(
    PipelinePopper& pp, bool discard, std::string* str, std::unique_ptr<pl::Link> link)
{
    pl::Count* c;
    if (link) {
        c = new pl::Count(m->next_stack_id, m->count_buffer, std::move(link));
    } else if (discard) {
        c = new pl::Count(m->next_stack_id, nullptr);
    } else if (!str) {
        c = new pl::Count(m->next_stack_id, m->pipeline_stack.back());
    } else {
        c = new pl::Count(m->next_stack_id, *str);
    }
    pp.stack_id = m->next_stack_id;
    m->pipeline_stack.emplace_back(c);
    m->pipeline = c;
    ++m->next_stack_id;
}